

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgesture.cpp
# Opt level: O2

void QPinchGesture::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  long lVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  
  if (_c == WriteProperty) {
    if ((uint)_id < 0xb) {
      puVar1 = (undefined8 *)*_a;
      switch(_id) {
      case 0:
        *(undefined4 *)(*(long *)(_o + 8) + 0xa4) = *(undefined4 *)puVar1;
        return;
      case 1:
        *(undefined4 *)(*(long *)(_o + 8) + 0xa8) = *(undefined4 *)puVar1;
        return;
      case 2:
        *(undefined8 *)(*(long *)(_o + 8) + 0xe0) = *puVar1;
        return;
      case 3:
        *(undefined8 *)(*(long *)(_o + 8) + 0xe8) = *puVar1;
        return;
      case 4:
        *(undefined8 *)(*(long *)(_o + 8) + 0xf0) = *puVar1;
        return;
      case 5:
        *(undefined8 *)(*(long *)(_o + 8) + 0xf8) = *puVar1;
        return;
      case 6:
        *(undefined8 *)(*(long *)(_o + 8) + 0x100) = *puVar1;
        return;
      case 7:
        *(undefined8 *)(*(long *)(_o + 8) + 0x108) = *puVar1;
        return;
      case 8:
        lVar2 = *(long *)(_o + 8);
        uVar3 = puVar1[1];
        *(undefined8 *)(lVar2 + 0xb0) = *puVar1;
        *(undefined8 *)(lVar2 + 0xb8) = uVar3;
        return;
      case 9:
        lVar2 = *(long *)(_o + 8);
        uVar3 = puVar1[1];
        *(undefined8 *)(lVar2 + 0xc0) = *puVar1;
        *(undefined8 *)(lVar2 + 200) = uVar3;
        return;
      case 10:
        lVar2 = *(long *)(_o + 8);
        uVar3 = puVar1[1];
        *(undefined8 *)(lVar2 + 0xd0) = *puVar1;
        *(undefined8 *)(lVar2 + 0xd8) = uVar3;
      }
    }
    return;
  }
  if (_c != ReadProperty) {
    return;
  }
  if (10 < (uint)_id) {
    return;
  }
  puVar1 = (undefined8 *)*_a;
  switch(_id) {
  case 0:
    uVar4 = *(undefined4 *)(*(long *)(_o + 8) + 0xa4);
    goto LAB_002cd2bf;
  case 1:
    uVar4 = *(undefined4 *)(*(long *)(_o + 8) + 0xa8);
LAB_002cd2bf:
    *(undefined4 *)puVar1 = uVar4;
    return;
  case 2:
    uVar4 = (undefined4)*(undefined8 *)(*(long *)(_o + 8) + 0xe0);
    uVar5 = (undefined4)((ulong)*(undefined8 *)(*(long *)(_o + 8) + 0xe0) >> 0x20);
    break;
  case 3:
    uVar4 = (undefined4)*(undefined8 *)(*(long *)(_o + 8) + 0xe8);
    uVar5 = (undefined4)((ulong)*(undefined8 *)(*(long *)(_o + 8) + 0xe8) >> 0x20);
    break;
  case 4:
    uVar4 = (undefined4)*(undefined8 *)(*(long *)(_o + 8) + 0xf0);
    uVar5 = (undefined4)((ulong)*(undefined8 *)(*(long *)(_o + 8) + 0xf0) >> 0x20);
    break;
  case 5:
    uVar4 = (undefined4)*(undefined8 *)(*(long *)(_o + 8) + 0xf8);
    uVar5 = (undefined4)((ulong)*(undefined8 *)(*(long *)(_o + 8) + 0xf8) >> 0x20);
    break;
  case 6:
    uVar4 = (undefined4)*(undefined8 *)(*(long *)(_o + 8) + 0x100);
    uVar5 = (undefined4)((ulong)*(undefined8 *)(*(long *)(_o + 8) + 0x100) >> 0x20);
    break;
  case 7:
    uVar4 = (undefined4)*(undefined8 *)(*(long *)(_o + 8) + 0x108);
    uVar5 = (undefined4)((ulong)*(undefined8 *)(*(long *)(_o + 8) + 0x108) >> 0x20);
    break;
  case 8:
    lVar2 = *(long *)(_o + 8);
    uVar4 = *(undefined4 *)(lVar2 + 0xb0);
    uVar5 = *(undefined4 *)(lVar2 + 0xb4);
    uVar6 = *(undefined4 *)(lVar2 + 0xb8);
    uVar7 = *(undefined4 *)(lVar2 + 0xbc);
    goto LAB_002cd339;
  case 9:
    lVar2 = *(long *)(_o + 8);
    uVar4 = *(undefined4 *)(lVar2 + 0xc0);
    uVar5 = *(undefined4 *)(lVar2 + 0xc4);
    uVar6 = *(undefined4 *)(lVar2 + 200);
    uVar7 = *(undefined4 *)(lVar2 + 0xcc);
    goto LAB_002cd339;
  case 10:
    lVar2 = *(long *)(_o + 8);
    uVar4 = *(undefined4 *)(lVar2 + 0xd0);
    uVar5 = *(undefined4 *)(lVar2 + 0xd4);
    uVar6 = *(undefined4 *)(lVar2 + 0xd8);
    uVar7 = *(undefined4 *)(lVar2 + 0xdc);
LAB_002cd339:
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)((long)puVar1 + 4) = uVar5;
    *(undefined4 *)(puVar1 + 1) = uVar6;
    *(undefined4 *)((long)puVar1 + 0xc) = uVar7;
    return;
  }
  *puVar1 = CONCAT44(uVar5,uVar4);
  return;
}

Assistant:

void QPinchGesture::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QPinchGesture *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: QtMocHelpers::assignFlags<ChangeFlags>(_v, _t->totalChangeFlags()); break;
        case 1: QtMocHelpers::assignFlags<ChangeFlags>(_v, _t->changeFlags()); break;
        case 2: *reinterpret_cast<qreal*>(_v) = _t->totalScaleFactor(); break;
        case 3: *reinterpret_cast<qreal*>(_v) = _t->lastScaleFactor(); break;
        case 4: *reinterpret_cast<qreal*>(_v) = _t->scaleFactor(); break;
        case 5: *reinterpret_cast<qreal*>(_v) = _t->totalRotationAngle(); break;
        case 6: *reinterpret_cast<qreal*>(_v) = _t->lastRotationAngle(); break;
        case 7: *reinterpret_cast<qreal*>(_v) = _t->rotationAngle(); break;
        case 8: *reinterpret_cast<QPointF*>(_v) = _t->startCenterPoint(); break;
        case 9: *reinterpret_cast<QPointF*>(_v) = _t->lastCenterPoint(); break;
        case 10: *reinterpret_cast<QPointF*>(_v) = _t->centerPoint(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTotalChangeFlags(*reinterpret_cast<ChangeFlags*>(_v)); break;
        case 1: _t->setChangeFlags(*reinterpret_cast<ChangeFlags*>(_v)); break;
        case 2: _t->setTotalScaleFactor(*reinterpret_cast<qreal*>(_v)); break;
        case 3: _t->setLastScaleFactor(*reinterpret_cast<qreal*>(_v)); break;
        case 4: _t->setScaleFactor(*reinterpret_cast<qreal*>(_v)); break;
        case 5: _t->setTotalRotationAngle(*reinterpret_cast<qreal*>(_v)); break;
        case 6: _t->setLastRotationAngle(*reinterpret_cast<qreal*>(_v)); break;
        case 7: _t->setRotationAngle(*reinterpret_cast<qreal*>(_v)); break;
        case 8: _t->setStartCenterPoint(*reinterpret_cast<QPointF*>(_v)); break;
        case 9: _t->setLastCenterPoint(*reinterpret_cast<QPointF*>(_v)); break;
        case 10: _t->setCenterPoint(*reinterpret_cast<QPointF*>(_v)); break;
        default: break;
        }
    }
}